

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O2

OwnFd __thiscall kj::anon_unknown_9::DiskFilesystem::openDir(DiskFilesystem *this,char *dir)

{
  int iVar1;
  int osErrorNumber;
  Fault f;
  Fault local_20;
  
  do {
    iVar1 = open64(dir,0x90000);
    if (-1 < iVar1) goto LAB_003c193b;
    osErrorNumber = kj::_::Debug::getOsErrorNumber(false);
  } while (osErrorNumber == -1);
  if (osErrorNumber != 0) {
    kj::_::Debug::Fault::Fault
              (&local_20,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,0x68e,osErrorNumber,"_kj_fd = open(dir, 00 | 02000000 | 0200000)","");
    kj::_::Debug::Fault::fatal(&local_20);
  }
LAB_003c193b:
  *(int *)&(this->super_Filesystem)._vptr_Filesystem = iVar1;
  return (OwnFd)(int)this;
}

Assistant:

static OwnFd openDir(const char* dir) {
    auto result = KJ_SYSCALL_FD(open(dir, O_RDONLY | MAYBE_O_CLOEXEC | MAYBE_O_DIRECTORY));
#ifndef O_CLOEXEC
    setCloexec(result);
#endif
    return result;
  }